

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::report_error(char *message)

{
  format_error *this;
  char *message_local;
  
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::runtime_error(this,message);
  __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

FMT_FUNC void report_error(const char* message) {
#if FMT_USE_EXCEPTIONS
  // Use FMT_THROW instead of throw to avoid bogus unreachable code warnings
  // from MSVC.
  FMT_THROW(format_error(message));
#else
  fputs(message, stderr);
  abort();
#endif
}